

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O3

SquareMatrix<double> __thiscall qclab::qgates::RotationY<double>::matrix(RotationY<double> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<double> SVar6;
  
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)0x2;
  puVar5 = (undefined4 *)operator_new__(0x20);
  *(undefined4 **)&(this->super_QRotationGate1<double>).super_QGate1<double>.qubit_ = puVar5;
  uVar1 = *(undefined4 *)(in_RSI + 0x10);
  uVar2 = *(undefined4 *)(in_RSI + 0x14);
  uVar3 = *(undefined4 *)(in_RSI + 0x18);
  uVar4 = *(uint *)(in_RSI + 0x1c);
  *puVar5 = uVar1;
  puVar5[1] = uVar2;
  puVar5[2] = uVar3;
  puVar5[3] = uVar4;
  puVar5[4] = uVar3;
  puVar5[5] = uVar4 ^ 0x80000000;
  puVar5[6] = uVar1;
  puVar5[7] = uVar2;
  SVar6.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar6.size_ = (size_type_conflict)this;
  return SVar6;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }